

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Minefield_Data_PDU::AddMine(Minefield_Data_PDU *this,Mine *M)

{
  KBOOL KVar1;
  KUINT16 KVar2;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  value_type *local_18;
  Mine *M_local;
  Minefield_Data_PDU *this_local;
  
  local_18 = M;
  M_local = (Mine *)this;
  KVar1 = DATA_TYPE::MinefieldDataFilter::operator!=
                    (&M->super_MinefieldDataFilter,&this->m_DataFilter);
  if (!KVar1) {
    std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::push_back
              (&this->m_vMines,local_18);
    KVar2 = DATA_TYPE::Mine::GetLength(local_18);
    (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
         (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength + KVar2;
    this->m_ui8NumMines = this->m_ui8NumMines + '\x01';
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddMine",&local_39);
  KException::KException<char_const*>
            (this_00,&local_38,10,
             "The Mine filter does not match the PDU MinefieldDataFilter.\t\t\t                                                            All mines must have the same optional values set as specified by\t                                                            the PDU MinefieldDataFilter. This mine has been ignored."
            );
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Data_PDU::AddMine(const Mine &M) noexcept(false)
{
    // First check the mine has the same optional fields set as MinefieldDataFilter.
    if( M.MinefieldDataFilter::operator != ( m_DataFilter ) )
    {
        throw KException( __FUNCTION__, INVALID_OPERATION, "The Mine filter does not match the PDU MinefieldDataFilter.			\
                                                            All mines must have the same optional values set as specified by	\
                                                            the PDU MinefieldDataFilter. This mine has been ignored." );
    }

    m_vMines.push_back( M );
    m_ui16PDULength += M.GetLength();
    ++m_ui8NumMines;
}